

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void __thiscall TestPageControl::testBusy(TestPageControl *this)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  QColor *pQVar6;
  long lVar7;
  int iVar8;
  PageControl p;
  QSignalSpy spy;
  PageControl PStack_d8;
  undefined1 local_a8 [32];
  long local_88;
  
  QtMWidgets::PageControl::PageControl(&PStack_d8,(QWidget *)0x0);
  local_a8._0_4_ = this->m_btnSize * 3;
  local_a8._4_4_ = this->m_btnSize << 2;
  QWidget::resize((QSize *)&PStack_d8);
  QWidget::show();
  bVar3 = (bool)QTest::qWaitForWindowActive(&PStack_d8.super_QWidget,5000);
  cVar4 = QTest::qVerify(bVar3,"QTest::qWaitForWindowActive( &p )","",
                         "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]qtmwidgets/tests/auto/pagecontrol/main.cpp"
                         ,0x24);
  if (cVar4 != '\0') {
    iVar8 = *(int *)(PStack_d8._32_8_ + 0x1c);
    iVar1 = *(int *)(PStack_d8._32_8_ + 0x14);
    iVar2 = this->m_btnSize;
    QColor::QColor((QColor *)local_a8,red);
    QtMWidgets::PageControl::setPageIndicatorColor(&PStack_d8,(QColor *)local_a8);
    QColor::QColor((QColor *)local_a8,red);
    QtMWidgets::PageControl::setCurrentPageIndicatorColor(&PStack_d8,(QColor *)local_a8);
    pQVar6 = QtMWidgets::PageControl::pageIndicatorColor(&PStack_d8);
    QColor::QColor((QColor *)local_a8,red);
    bVar3 = (bool)QColor::operator==(pQVar6,(QColor *)local_a8);
    cVar4 = QTest::qVerify(bVar3,"p.pageIndicatorColor() == Qt::red","",
                           "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]qtmwidgets/tests/auto/pagecontrol/main.cpp"
                           ,0x2b);
    if (cVar4 != '\0') {
      pQVar6 = QtMWidgets::PageControl::currentPageIndicatorColor(&PStack_d8);
      QColor::QColor((QColor *)local_a8,red);
      bVar3 = (bool)QColor::operator==(pQVar6,(QColor *)local_a8);
      cVar4 = QTest::qVerify(bVar3,"p.currentPageIndicatorColor() == Qt::red","",
                             "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]qtmwidgets/tests/auto/pagecontrol/main.cpp"
                             ,0x2c);
      if (cVar4 != '\0') {
        QtMWidgets::PageControl::setCount(&PStack_d8,10);
        QtMWidgets::PageControl::setCurrentIndex(&PStack_d8,4);
        iVar5 = QtMWidgets::PageControl::count(&PStack_d8);
        cVar4 = QTest::qVerify(iVar5 == 10,"p.count() == 10","",
                               "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]qtmwidgets/tests/auto/pagecontrol/main.cpp"
                               ,0x32);
        if (cVar4 != '\0') {
          iVar5 = QtMWidgets::PageControl::currentIndex(&PStack_d8);
          cVar4 = QTest::qVerify(iVar5 == 4,"p.currentIndex() == 4","",
                                 "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]qtmwidgets/tests/auto/pagecontrol/main.cpp"
                                 ,0x33);
          if (cVar4 != '\0') {
            iVar5 = this->m_btnSize;
            iVar8 = (((iVar8 - iVar1) + 1) / iVar2) * iVar5 + *(int *)(PStack_d8._32_8_ + 0x14);
            iVar8 = ((*(int *)(PStack_d8._32_8_ + 0x1c) - iVar8) -
                    ((*(int *)(PStack_d8._32_8_ + 0x1c) - iVar8) + 1 >> 0x1f)) + 1 >> 1;
            lVar7 = (long)(iVar5 + iVar8 + -1) + (long)iVar8;
            QTest::mouseEvent(MouseClick,&PStack_d8.super_QWidget,LeftButton,(KeyboardModifiers)0x0,
                              (QPoint)((ulong)(lVar7 - (lVar7 >> 0x3f)) >> 1 & 0xffffffff |
                                      (ulong)(uint)((iVar5 - (iVar5 + -1 >> 0x1f)) + -1 >> 1) <<
                                      0x20),0x14);
            QTest::qWait(0x32);
            iVar8 = QtMWidgets::PageControl::currentIndex(&PStack_d8);
            cVar4 = QTest::qVerify(iVar8 == 0,"p.currentIndex() == 0","",
                                   "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]qtmwidgets/tests/auto/pagecontrol/main.cpp"
                                   ,0x3b);
            if (cVar4 != '\0') {
              local_a8._4_4_ = this->m_btnSize * 2;
              local_a8._0_4_ = this->m_btnSize * 10;
              QWidget::resize((QSize *)&PStack_d8);
              QTest::qWait(0x32);
              iVar8 = *(int *)(PStack_d8._32_8_ + 0x14);
              iVar1 = *(int *)(PStack_d8._32_8_ + 0x1c);
              iVar2 = this->m_btnSize;
              QSignalSpy::QSignalSpy<void(QtMWidgets::PageControl::*)(int,int)>
                        ((QSignalSpy *)local_a8,&PStack_d8,0x1527ac);
              iVar5 = this->m_btnSize;
              iVar8 = (((iVar1 - iVar8) + 1) / iVar2) * iVar5 + *(int *)(PStack_d8._32_8_ + 0x14);
              iVar8 = (((*(int *)(PStack_d8._32_8_ + 0x1c) - iVar8) -
                       ((*(int *)(PStack_d8._32_8_ + 0x1c) - iVar8) + 1 >> 0x1f)) + 1 >> 1) +
                      iVar5 * 4;
              lVar7 = (long)(iVar5 + iVar8 + -1) + (long)iVar8;
              QTest::mouseEvent(MouseClick,&PStack_d8.super_QWidget,LeftButton,
                                (KeyboardModifiers)0x0,
                                (QPoint)((ulong)(lVar7 - (lVar7 >> 0x3f)) >> 1 & 0xffffffff |
                                        (ulong)(uint)((iVar5 - (iVar5 + -1 >> 0x1f)) + -1 >> 1) <<
                                        0x20),0x14);
              QTest::qWait(0x32);
              iVar8 = QtMWidgets::PageControl::currentIndex(&PStack_d8);
              cVar4 = QTest::qVerify(iVar8 == 4,"p.currentIndex() == 4","",
                                     "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]qtmwidgets/tests/auto/pagecontrol/main.cpp"
                                     ,0x4b);
              if (cVar4 != '\0') {
                QTest::qVerify(local_88 == 1,"spy.count() == 1","",
                               "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]qtmwidgets/tests/auto/pagecontrol/main.cpp"
                               ,0x4c);
              }
              QSignalSpy::~QSignalSpy((QSignalSpy *)local_a8);
            }
          }
        }
      }
    }
  }
  QtMWidgets::PageControl::~PageControl(&PStack_d8);
  return;
}

Assistant:

void testBusy()
	{
		QtMWidgets::PageControl p;

		p.resize( m_btnSize * 3, m_btnSize * 4 );
		p.show();

		QVERIFY( QTest::qWaitForWindowActive( &p ) );

		int count = p.width() / m_btnSize;

		p.setPageIndicatorColor( Qt::red );
		p.setCurrentPageIndicatorColor( Qt::red );

		QVERIFY( p.pageIndicatorColor() == Qt::red );
		QVERIFY( p.currentPageIndicatorColor() == Qt::red );

		p.setCount( 10 );

		p.setCurrentIndex( 4 );

		QVERIFY( p.count() == 10 );
		QVERIFY( p.currentIndex() == 4 );

		QTest::mouseClick( &p, Qt::LeftButton, {},
			QRect( ( p.width() - m_btnSize * count ) / 2, 0, m_btnSize, m_btnSize ).center(),
			20 );

		QTest::qWait( 50 );

		QVERIFY( p.currentIndex() == 0 );

		p.resize( m_btnSize * 10, m_btnSize * 2 );

		QTest::qWait( 50 );

		count = p.width() / m_btnSize;

		QSignalSpy spy( &p, &QtMWidgets::PageControl::currentChanged );

		QTest::mouseClick( &p, Qt::LeftButton, {},
			QRect( ( p.width() - m_btnSize * count ) / 2 + m_btnSize * 4, 0,
				m_btnSize, m_btnSize ).center(), 20 );

		QTest::qWait( 50 );

		QVERIFY( p.currentIndex() == 4 );
		QVERIFY( spy.count() == 1 );
	}